

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O0

int64_t yactfr::internal::anon_unknown_0::readFlSIntLe47At3(uint8_t *buf)

{
  ulong uVar1;
  ulong local_18;
  uint64_t res;
  uint8_t *buf_local;
  
  uVar1 = ((ulong)*(uint6 *)(buf + 1) & 0x3ffffffffff) << 5;
  local_18 = (long)((int)(uint)*buf >> 3) | uVar1;
  if (uVar1 >> 0x2e != 0) {
    local_18 = local_18 | 0xffff800000000000;
  }
  return local_18;
}

Assistant:

std::int64_t readFlSIntLe47At3(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 5;
    res |= (buf[0] >> 3);
    res &= UINT64_C(0x7fffffffffff);

    if (res >> 46) {
        res |= UINT64_C(0xffff800000000000);
    }

    return static_cast<std::int64_t>(res);
}